

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * __thiscall
duckdb::ComplexJSON::GetValueRecursive_abi_cxx11_
          (string *__return_storage_ptr__,ComplexJSON *this,ComplexJSON *child)

{
  yyjson_val_pool *pyVar1;
  yyjson_alc *alc;
  yyjson_str_pool *pool;
  _Hash_node_base __src;
  _Hash_node_base *__n;
  ulong uVar2;
  long lVar3;
  _Alloc_hider __src_00;
  size_type __n_00;
  bool bVar4;
  yyjson_mut_doc *this_00;
  type this_01;
  yyjson_mut_val *pyVar5;
  yyjson_mut_doc *extraout_RDX;
  yyjson_mut_doc *doc;
  ComplexJSON *child_00;
  yyjson_mut_doc *extraout_RDX_00;
  yyjson_mut_doc *extraout_RDX_01;
  yyjson_mut_val *pyVar6;
  yyjson_mut_val *pyVar7;
  char *pcVar8;
  __node_base *p_Var9;
  yyjson_mut_val *pyVar10;
  string value_str;
  
  if (this->is_object != true) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
    return __return_storage_ptr__;
  }
  pyVar7 = (yyjson_mut_val *)0x0;
  this_00 = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  doc = extraout_RDX;
  if (this_00 == (yyjson_mut_doc *)0x0) goto LAB_017a92e1;
  pyVar1 = &this_00->val_pool;
  pyVar7 = (this_00->val_pool).cur;
  if ((this_00->val_pool).end == pyVar7) {
    bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&this_00->alc,1);
    doc = extraout_RDX_01;
    if (bVar4) {
      pyVar7 = pyVar1->cur;
      goto LAB_017a92c5;
    }
LAB_017a95c3:
    pyVar7 = (yyjson_mut_val *)0x0;
  }
  else {
LAB_017a92c5:
    pyVar1->cur = pyVar7 + 1;
    if (pyVar7 == (yyjson_mut_val *)0x0) goto LAB_017a95c3;
    pyVar7->tag = 7;
  }
  this_00->root = pyVar7;
LAB_017a92e1:
  p_Var9 = &(this->obj_value)._M_h._M_before_begin;
  pyVar1 = &this_00->val_pool;
  alc = &this_00->alc;
  pool = &this_00->str_pool;
  do {
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 == (__node_base *)0x0) {
      WriteJsonToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)this_00,doc);
      return __return_storage_ptr__;
    }
    if (this_00 == (yyjson_mut_doc *)0x0) {
LAB_017a9514:
      pyVar6 = (yyjson_mut_val *)0x0;
    }
    else {
      __src._M_nxt = p_Var9[1]._M_nxt;
      pyVar6 = (yyjson_mut_val *)0x0;
      if (__src._M_nxt != (_Hash_node_base *)0x0) {
        __n = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor;
        pyVar6 = (this_00->val_pool).cur;
        if ((this_00->val_pool).end == pyVar6) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (bVar4) {
            pyVar6 = pyVar1->cur;
            goto LAB_017a933a;
          }
          pyVar6 = (yyjson_mut_val *)0x0;
        }
        else {
LAB_017a933a:
          pyVar1->cur = pyVar6 + 1;
        }
        pcVar8 = (this_00->str_pool).cur;
        if ((_Hash_node_base *)((this_00->str_pool).end + -(long)pcVar8) <= __n) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                            (pool,alc,(usize)((long)&__n->_M_nxt + 1));
          if (!bVar4) goto LAB_017a9514;
          pcVar8 = pool->cur;
        }
        pool->cur = pcVar8 + (long)__n + 1;
        if (pcVar8 != (char *)0x0) {
          switchD_016b0717::default(pcVar8,__src._M_nxt,(size_t)__n);
          pcVar8[(long)__n] = '\0';
          if (pyVar6 != (yyjson_mut_val *)0x0) {
            pyVar6->tag = (long)__n << 8 | 5;
            (pyVar6->uni).ptr = pcVar8;
            goto LAB_017a939e;
          }
        }
        goto LAB_017a9514;
      }
    }
LAB_017a939e:
    this_01 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
              operator*((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                         *)(p_Var9 + 5));
    GetValueRecursive_abi_cxx11_(&value_str,this_01,child_00);
    __n_00 = value_str._M_string_length;
    __src_00 = value_str._M_dataplus;
    if (this_00 == (yyjson_mut_doc *)0x0) {
LAB_017a9562:
      pyVar10 = (yyjson_mut_val *)0x0;
    }
    else {
      pyVar10 = (yyjson_mut_val *)0x0;
      if (value_str._M_dataplus._M_p != (pointer)0x0) {
        pyVar10 = (this_00->val_pool).cur;
        if ((this_00->val_pool).end == pyVar10) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (bVar4) {
            pyVar10 = pyVar1->cur;
            goto LAB_017a93e5;
          }
          pyVar10 = (yyjson_mut_val *)0x0;
        }
        else {
LAB_017a93e5:
          pyVar1->cur = pyVar10 + 1;
        }
        pcVar8 = (this_00->str_pool).cur;
        if ((ulong)((long)(this_00->str_pool).end - (long)pcVar8) <= __n_00) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pool,alc,__n_00 + 1);
          if (!bVar4) goto LAB_017a9562;
          pcVar8 = pool->cur;
        }
        pool->cur = pcVar8 + __n_00 + 1;
        if (pcVar8 != (char *)0x0) {
          switchD_016b0717::default(pcVar8,__src_00._M_p,__n_00);
          pcVar8[__n_00] = '\0';
          if (pyVar10 != (yyjson_mut_val *)0x0) {
            pyVar10->tag = __n_00 << 8 | 5;
            (pyVar10->uni).ptr = pcVar8;
            goto LAB_017a9448;
          }
        }
        goto LAB_017a9562;
      }
    }
LAB_017a9448:
    if ((((pyVar7 != (yyjson_mut_val *)0x0) && (uVar2 = pyVar7->tag, (~(uint)uVar2 & 7) == 0)) &&
        (pyVar6 != (yyjson_mut_val *)0x0)) &&
       (((pyVar6->tag & 7) == 5 && (pyVar10 != (yyjson_mut_val *)0x0)))) {
      pyVar5 = pyVar6;
      if (0xff < uVar2) {
        lVar3 = *(long *)((pyVar7->uni).u64 + 0x10);
        pyVar5 = *(yyjson_mut_val **)(lVar3 + 0x10);
        *(yyjson_mut_val **)(lVar3 + 0x10) = pyVar6;
      }
      pyVar10->next = pyVar5;
      pyVar6->next = pyVar10;
      (pyVar7->uni).str = (char *)pyVar6;
      pyVar7->tag = (uVar2 & 0xff) + (uVar2 & 0xffffffffffffff00) + 0x100;
    }
    ::std::__cxx11::string::~string((string *)&value_str);
    doc = extraout_RDX_00;
  } while( true );
}

Assistant:

string ComplexJSON::GetValueRecursive(const ComplexJSON &child) {
	if (child.is_object) {
		// We have to construct the nested json
		yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
		yyjson_mut_val *root = yyjson_mut_obj(doc);
		yyjson_mut_doc_set_root(doc, root);
		for (const auto &object : child.obj_value) {
			auto key = yyjson_mut_strncpy(doc, object.first.c_str(), object.first.size());
			auto value_str = GetValueRecursive(*object.second);
			auto value = yyjson_mut_strncpy(doc, value_str.c_str(), value_str.size());
			yyjson_mut_obj_add(root, key, value);
		}
		return WriteJsonToString(doc);
	} else {
		// simple string we can just write
		return child.str_value;
	}
}